

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionRewriting.cpp
# Opt level: O3

ClauseIterator __thiscall
Inferences::FunctionDefinitionRewriting::generateClauses
          (FunctionDefinitionRewriting *this,Clause *premise)

{
  Inference *pIVar1;
  undefined1 uVar2;
  byte bVar3;
  FunctionDefinitionRewriting *pFVar4;
  char cVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
  VVar10;
  undefined7 uVar14;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 uVar11;
  undefined7 extraout_var_01;
  Value VVar12;
  _func_int **pp_Var13;
  Value VVar15;
  Value in_RDX;
  uint uVar16;
  Value VVar17;
  byte bVar18;
  Value unaff_R13;
  byte bVar19;
  Value VVar20;
  bool bVar21;
  Value local_208;
  Value VStack_200;
  Value local_1f8;
  ulong uStack_1f0;
  Value local_1e8;
  Value VStack_1e0;
  Value VStack_1d8;
  Value VStack_1d0;
  ulong uStack_1c8;
  Value local_1c0;
  Value VStack_1b8;
  undefined1 local_1b0 [8];
  Value VStack_1a8;
  byte local_1a0;
  Value local_198;
  char local_190;
  _func_int *local_188;
  Value local_178;
  Value VStack_170;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  Value local_158;
  ulong uStack_150;
  byte local_148;
  Value local_140;
  byte local_138;
  Value local_130;
  Value local_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  Value local_108;
  ulong uStack_100;
  byte local_f8;
  Value local_f0;
  byte local_e8;
  Value local_e0;
  Value local_d8;
  undefined8 uStack_d0;
  Value local_c8;
  Value local_c0;
  Value local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  FunctionDefinitionRewriting *local_a0;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  byte local_60;
  Value local_58;
  byte local_50;
  Value local_48;
  char local_40;
  _func_int *local_38;
  
  uVar16 = *(uint *)((long)in_RDX + 0x38) & 0xfffff;
  VStack_1d8 = (Value)0x0;
  VStack_1d0 = (Value)(CONCAT44(VStack_1d0._4_4_,*(uint *)((long)in_RDX + 0x38)) &
                      0xffffffff000fffff);
  VStack_1e0 = in_RDX;
  local_a0 = this;
  if (uVar16 == 0) {
    VStack_1d0 = (Value)0x0;
    uStack_1c8 = uStack_1c8 & 0xffffffff00000000;
    local_1c0 = (Value)((ulong)local_1c0 & 0xffffffffffffff00);
    VStack_1d8 = in_RDX;
  }
  else {
    Lib::
    MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>
    ::next((MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>
            *)&local_208.init);
    uStack_1c8 = (ulong)VStack_1d0;
    VVar20 = VStack_1d8;
    VVar17 = VStack_1e0;
    unaff_R13 = local_208;
    if (local_208 == (Value)0x0) {
      VStack_1e0 = local_1e8;
      VStack_1d8 = VVar17;
      VStack_1d0 = VVar20;
      local_1c0._0_1_ = 1;
      VStack_1b8 = (Value)0x0;
      unaff_R13 = (Value)0x0;
    }
    else {
      local_1c0 = local_208;
      iVar8 = *(int *)((long)local_208 + 8) + 2;
      *(int *)((long)local_208 + 8) = iVar8;
      if (iVar8 == 0) {
        (**(code **)(*(long *)local_208 + 8))(local_208);
        iVar8 = *(int *)((long)unaff_R13 + 8);
      }
      iVar8 = iVar8 + -1;
      *(int *)((long)unaff_R13 + 8) = iVar8;
      if (iVar8 == 0) {
        (**(code **)(*(long *)unaff_R13 + 8))(unaff_R13);
        iVar8 = *(int *)((long)unaff_R13 + 8);
      }
      *(int *)((long)unaff_R13 + 8) = iVar8 + -1;
      if (iVar8 + -1 == 0) {
        (**(code **)(*(long *)unaff_R13 + 8))(unaff_R13);
        iVar8 = *(int *)((long)unaff_R13 + 8) + 1;
      }
      VVar20 = VStack_1d8;
      VVar17 = VStack_1e0;
      *(int *)((long)unaff_R13 + 8) = iVar8;
      local_d8 = VStack_1d0;
      uStack_d0 = 0;
      if (iVar8 == 0) {
        (**(code **)(*(long *)unaff_R13 + 8))(unaff_R13);
      }
      pIVar1 = (Inference *)((long)unaff_R13 + 8);
      *(int *)pIVar1 = *(int *)pIVar1 + -1;
      if (*(int *)pIVar1 == 0) {
        (**(code **)(*(long *)unaff_R13 + 8))(unaff_R13);
      }
      iVar8 = *(int *)((long)unaff_R13 + 8) + 2;
      *(int *)((long)unaff_R13 + 8) = iVar8;
      if (iVar8 == 0) {
        (**(code **)(*(long *)unaff_R13 + 8))(unaff_R13);
        iVar8 = *(int *)((long)unaff_R13 + 8);
      }
      VStack_1e0 = local_1e8;
      VStack_1d8 = VVar17;
      VStack_1d0 = VVar20;
      uStack_1c8 = (ulong)local_d8;
      local_1c0._0_1_ = 1;
      VStack_1b8 = unaff_R13;
      *(int *)((long)unaff_R13 + 8) = iVar8 + 2;
    }
  }
  local_1e8 = (Value)premise;
  local_d8 = unaff_R13;
  bVar6 = Lib::
          MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
          ::hasNext((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                     *)&local_1e8.init);
  if (bVar6) {
    VVar10 = Lib::
             MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
             ::next((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                     *)&local_208.init);
    premise = (Clause *)local_208;
    if (local_208 == (Value)0x0) {
      local_1b0[0] = 1;
      VStack_1a8 = (Value)0x0;
    }
    else {
      local_1b0[0] = 1;
      VStack_1a8 = local_208;
      iVar8 = *(int *)((long)local_208 + 8) + 2;
      *(int *)((long)local_208 + 8) = iVar8;
      if (iVar8 == 0) {
        (**(code **)(*(long *)local_208 + 8))(local_208);
        iVar8 = *(int *)((long)local_208 + 8);
      }
      iVar8 = iVar8 + -1;
      *(int *)((long)local_208 + 8) = iVar8;
      if (iVar8 == 0) {
        (**(code **)(*(long *)local_208 + 8))(local_208);
        iVar8 = *(int *)((long)local_208 + 8);
      }
      uVar9 = iVar8 - 1;
      VVar10._core = (IteratorCore<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
                      *)(ulong)uVar9;
      *(uint *)((long)local_208 + 8) = uVar9;
      if (uVar9 == 0) {
        VVar10._core = (IteratorCore<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
                        *)(**(code **)(*(long *)local_208 + 8))(local_208);
      }
    }
  }
  else {
    VVar10._core = (IteratorCore<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
                    *)local_1b0;
    local_1b0 = (undefined1  [8])0x0;
    VStack_1a8 = (Value)0x0;
  }
  bVar6 = uVar16 != 0;
  uVar14 = (undefined7)((ulong)VVar10._core >> 8);
  bVar21 = unaff_R13 != (Value)0x0;
  VVar17._0_1_ = bVar21 && bVar6;
  VVar17._1_3_ = (int3)(uVar16 >> 8);
  VVar17._4_4_ = 0;
  if (bVar21 && bVar6) {
    pIVar1 = (Inference *)((long)unaff_R13 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)unaff_R13 + 8))(unaff_R13);
      uVar14 = extraout_var;
    }
  }
  local_208 = VStack_1e0;
  VVar20 = local_208;
  VStack_200 = VStack_1d8;
  VVar12 = VStack_200;
  local_1f8 = VStack_1d0;
  uStack_1f0 = uStack_1c8;
  uVar2 = local_1c0._0_1_;
  local_208._0_4_ = VStack_1e0._0_4_;
  local_208._4_4_ = VStack_1e0._4_4_;
  VStack_200._0_4_ = VStack_1d8._0_4_;
  VStack_200._4_4_ = VStack_1d8._4_4_;
  VVar15 = local_1e8;
  local_208 = VVar20;
  VStack_200 = VVar12;
  if (local_1c0._0_1_ == 1) {
    premise = (Clause *)VStack_1b8;
    if (VStack_1b8 == (Value)0x0) {
      if (local_1b0[0] != 0) goto LAB_004ccda1;
      local_f0 = VStack_1b8;
      premise = (Clause *)0x0;
    }
    else {
      *(int *)((long)VStack_1b8 + 8) = *(int *)((long)VStack_1b8 + 8) + 1;
      if (local_1b0[0] != 0) {
LAB_004ccda1:
        if (VStack_1a8 == (Value)0x0) {
          local_f0 = VStack_1b8;
          if (VStack_1b8 == (Value)0x0) {
            premise = (Clause *)0x0;
          }
          else {
            *(int *)((long)VStack_1b8 + 8) = *(int *)((long)VStack_1b8 + 8) + 1;
          }
          goto LAB_004ccebb;
        }
LAB_004ccdaf:
        iVar8 = *(int *)((long)VStack_1a8 + 8) + 1;
        *(int *)((long)VStack_1a8 + 8) = iVar8;
        local_120 = local_1e8;
        local_118 = local_208._0_4_;
        uStack_114 = local_208._4_4_;
        uStack_110 = VStack_200._0_4_;
        uStack_10c = VStack_200._4_4_;
        local_108 = VStack_1d0;
        uStack_100 = uStack_1c8;
        local_f8 = local_1c0._0_1_;
        if ((local_1c0._0_1_ != 0) && (local_f0 = (Value)premise, (Value)premise != (Value)0x0)) {
          *(int *)((long)premise + 8) = *(int *)((long)premise + 8) + 1;
        }
        local_e8 = local_1b0[0];
        local_e0 = VStack_1a8;
        *(int *)((long)VStack_1a8 + 8) = iVar8;
        if (iVar8 == 0) {
          (**(code **)(*(long *)VStack_1a8 + 8))();
          uVar14 = extraout_var_00;
        }
        goto LAB_004ccece;
      }
      local_f0 = VStack_1b8;
      *(int *)((long)VStack_1b8 + 8) = *(int *)((long)VStack_1b8 + 8) + 1;
    }
LAB_004cce73:
    uStack_10c = VStack_200._4_4_;
    uStack_110 = VStack_200._0_4_;
    uStack_114 = local_208._4_4_;
    local_118 = local_208._0_4_;
    local_f8 = local_1c0._0_1_;
    uStack_100 = uStack_1c8;
    local_108 = VStack_1d0;
    local_120 = local_1e8;
    local_e8 = local_1b0[0];
  }
  else {
    if (local_1b0[0] == 0) goto LAB_004cce73;
    if (VStack_1a8 != (Value)0x0) goto LAB_004ccdaf;
LAB_004ccebb:
    uStack_10c = VStack_200._4_4_;
    uStack_110 = VStack_200._0_4_;
    uStack_114 = local_208._4_4_;
    local_118 = local_208._0_4_;
    local_e8 = local_1b0[0];
    local_f8 = local_1c0._0_1_;
    uStack_100 = uStack_1c8;
    local_108 = VStack_1d0;
    local_120 = local_1e8;
    local_e0 = (Value)0x0;
  }
LAB_004ccece:
  bVar7 = (Value)premise == (Value)0x0 | uVar2 ^ 1;
  uVar11 = CONCAT71(uVar14,bVar7);
  if (bVar7 == 0) {
    pIVar1 = (Inference *)((long)premise + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      uVar11 = (**(code **)(*(long *)premise + 8))(premise);
    }
  }
  if ((local_1b0[0] == '\x01') && (VStack_1a8 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)VStack_1a8 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      uVar11 = (**(code **)(*(long *)VStack_1a8 + 8))();
    }
  }
  local_c0._1_7_ = (undefined7)((ulong)uVar11 >> 8);
  local_c0._0_1_ = VStack_1b8 != (Value)0x0 & local_1c0._0_1_;
  if (local_c0._0_1_ == 1) {
    pIVar1 = (Inference *)((long)VStack_1b8 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      local_c0 = (Value)(**(code **)(*(long *)VStack_1b8 + 8))();
    }
  }
  if (bVar21 && bVar6) {
    iVar8 = *(int *)((long)unaff_R13 + 8) + -1;
    *(int *)((long)unaff_R13 + 8) = iVar8;
    if (iVar8 == 0) {
      (**(code **)(*(long *)unaff_R13 + 8))(unaff_R13);
      iVar8 = *(int *)((long)unaff_R13 + 8);
    }
    local_c0._0_4_ = iVar8 - 1;
    local_c0._4_4_ = 0;
    *(uint *)((long)unaff_R13 + 8) = local_c0._0_4_;
    if (local_c0._0_4_ == 0) {
      local_c0 = (Value)(**(code **)(*(long *)unaff_R13 + 8))(unaff_R13);
    }
  }
  bVar3 = local_e8;
  bVar7 = local_f8;
  local_208._4_4_ = uStack_114;
  local_208._0_4_ = local_118;
  VStack_200 = (Value)CONCAT44(uStack_10c,uStack_110);
  local_1f8 = local_108;
  uStack_1f0 = uStack_100;
  if (local_f8 == 1) {
    if (local_f0 == (Value)0x0) {
      local_c0 = (Value)0x0;
    }
    else {
      *(int *)((long)local_f0 + 8) = *(int *)((long)local_f0 + 8) + 1;
      local_c0 = local_f0;
    }
  }
  if (local_e8 == 1) {
    if (local_e0 == (Value)0x0) {
      VVar15 = (Value)0x0;
    }
    else {
      *(int *)((long)local_e0 + 8) = *(int *)((long)local_e0 + 8) + 1;
      VVar15 = local_e0;
    }
  }
  if (local_f8 != 0) {
    if (local_c0 == (Value)0x0) {
      VVar17 = (Value)0x0;
    }
    else {
      *(int *)((long)local_c0 + 8) = *(int *)((long)local_c0 + 8) + 1;
      VVar17 = local_c0;
    }
  }
  if (local_e8 != 0) {
    if (VVar15 == (Value)0x0) {
      unaff_R13 = (Value)0x0;
    }
    else {
      *(int *)((long)VVar15 + 8) = *(int *)((long)VVar15 + 8) + 1;
      unaff_R13 = VVar15;
    }
  }
  bVar18 = VVar17 != (Value)0x0 & local_f8;
  if (bVar18 == 1) {
    *(int *)((long)VVar17 + 8) = *(int *)((long)VVar17 + 8) + 1;
  }
  bVar19 = unaff_R13 != (Value)0x0 & local_e8;
  VStack_170 = local_120;
  local_b8 = VVar15;
  if ((bVar19 == 1) && (*(int *)((long)unaff_R13 + 8) == 0)) {
    local_c8 = local_120;
    (**(code **)(*(long *)unaff_R13 + 8))(unaff_R13);
    VStack_170 = local_c8;
  }
  if (bVar18 != 0) {
    pIVar1 = (Inference *)((long)VVar17 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      local_c8 = VStack_170;
      (**(code **)(*(long *)VVar17 + 8))(VVar17);
      VStack_170 = local_c8;
    }
  }
  VStack_1d8 = local_1f8;
  VStack_1d0 = (Value)uStack_1f0;
  local_1e8 = local_208;
  VVar20 = local_1e8;
  VStack_1e0 = VStack_200;
  VVar12 = VStack_1e0;
  local_1e8._0_4_ = local_208._0_4_;
  local_1e8._4_4_ = local_208._4_4_;
  VStack_1e0._0_4_ = VStack_200._0_4_;
  VStack_1e0._4_4_ = VStack_200._4_4_;
  local_1e8 = VVar20;
  VStack_1e0 = VVar12;
  local_178 = in_RDX;
  if (bVar7 == 0) {
    VVar20 = local_140;
    if (bVar3 == 0) goto LAB_004cd220;
    if (unaff_R13 == (Value)0x0) {
LAB_004cd270:
      uStack_15c = VStack_1e0._4_4_;
      uStack_160 = VStack_1e0._0_4_;
      uStack_164 = local_1e8._4_4_;
      local_168 = local_1e8._0_4_;
      local_148 = bVar7;
      uStack_150 = uStack_1f0;
      local_158 = local_1f8;
      local_138 = bVar3;
      local_130 = unaff_R13;
      goto LAB_004cd27f;
    }
LAB_004cd168:
    *(int *)((long)unaff_R13 + 8) = *(int *)((long)unaff_R13 + 8) + 1;
    local_168 = local_1e8._0_4_;
    uStack_164 = local_1e8._4_4_;
    uStack_160 = VStack_1e0._0_4_;
    uStack_15c = VStack_1e0._4_4_;
    local_158 = local_1f8;
    uStack_150 = uStack_1f0;
    local_148 = bVar7;
    if ((bVar7 != 0) && (local_140 = VVar17, VVar17 != (Value)0x0)) {
      *(int *)((long)VVar17 + 8) = *(int *)((long)VVar17 + 8) + 1;
    }
    local_138 = bVar3;
    local_130 = unaff_R13;
    if (*(int *)((long)unaff_R13 + 8) == 0) {
      in_RDX = (Value)(**(code **)(*(long *)unaff_R13 + 8))(unaff_R13);
    }
  }
  else {
    VVar20 = VVar17;
    if (VVar17 == (Value)0x0) {
      if (bVar3 != 0) goto LAB_004cd15f;
    }
    else {
      *(int *)((long)VVar17 + 8) = *(int *)((long)VVar17 + 8) + 1;
      if (bVar3 != 0) {
LAB_004cd15f:
        if (unaff_R13 == (Value)0x0) {
          local_140 = VVar17;
          if (VVar17 != (Value)0x0) {
            *(int *)((long)VVar17 + 8) = *(int *)((long)VVar17 + 8) + 1;
          }
          goto LAB_004cd270;
        }
        goto LAB_004cd168;
      }
      *(int *)((long)VVar17 + 8) = *(int *)((long)VVar17 + 8) + 1;
    }
LAB_004cd220:
    local_140 = VVar20;
    uStack_15c = VStack_1e0._4_4_;
    uStack_160 = VStack_1e0._0_4_;
    uStack_164 = local_1e8._4_4_;
    local_168 = local_1e8._0_4_;
    local_148 = bVar7;
    uStack_150 = uStack_1f0;
    local_158 = local_1f8;
    local_138 = bVar3;
  }
LAB_004cd27f:
  if (bVar18 != 0) {
    pIVar1 = (Inference *)((long)VVar17 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      in_RDX = (Value)(**(code **)(*(long *)VVar17 + 8))(VVar17);
    }
  }
  if (bVar19 != 0) {
    pIVar1 = (Inference *)((long)unaff_R13 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      in_RDX = (Value)(**(code **)(*(long *)unaff_R13 + 8))(unaff_R13);
    }
  }
  VVar20 = local_c0;
  if (bVar18 != 0) {
    pIVar1 = (Inference *)((long)VVar17 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      in_RDX = (Value)(**(code **)(*(long *)VVar17 + 8))(VVar17);
    }
  }
  uVar14 = in_RDX._1_7_;
  VVar17 = local_b8;
  if (local_b8 != (Value)0x0 && bVar3 == 1) {
    pIVar1 = (Inference *)((long)local_b8 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_b8 + 8))();
      uVar14 = extraout_var_01;
    }
  }
  VVar12._0_1_ = VVar20 == (Value)0x0 | bVar7 ^ 1;
  VVar12._1_7_ = uVar14;
  if (VVar12._0_1_ == 0) {
    pIVar1 = (Inference *)((long)VVar20 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      VVar17 = VVar20;
      VVar12 = (Value)(**(code **)(*(long *)VVar20 + 8))();
    }
  }
  bVar3 = local_138;
  bVar7 = local_148;
  local_208._4_4_ = uStack_164;
  local_208._0_4_ = local_168;
  VStack_200._4_4_ = uStack_15c;
  VStack_200._0_4_ = uStack_160;
  local_1f8 = local_158;
  uStack_1f0 = uStack_150;
  if (local_148 == 1) {
    if (local_140 == (Value)0x0) {
      VVar12 = (Value)0x0;
    }
    else {
      *(int *)((long)local_140 + 8) = *(int *)((long)local_140 + 8) + 1;
      VVar12 = local_140;
    }
  }
  local_c0 = VVar15;
  if (local_138 == 1) {
    if (local_130 == (Value)0x0) {
      local_c0 = (Value)0x0;
    }
    else {
      *(int *)((long)local_130 + 8) = *(int *)((long)local_130 + 8) + 1;
      local_c0 = local_130;
    }
  }
  if (local_148 != 0) {
    if (VVar12 == (Value)0x0) {
      VVar20 = (Value)0x0;
    }
    else {
      *(int *)((long)VVar12 + 8) = *(int *)((long)VVar12 + 8) + 1;
      VVar20 = VVar12;
    }
  }
  if (local_138 != 0) {
    if (local_c0 == (Value)0x0) {
      unaff_R13 = (Value)0x0;
    }
    else {
      *(int *)((long)local_c0 + 8) = *(int *)((long)local_c0 + 8) + 1;
      unaff_R13 = local_c0;
    }
  }
  bVar18 = VVar20 != (Value)0x0 & local_148;
  if (bVar18 == 1) {
    *(int *)((long)VVar20 + 8) = *(int *)((long)VVar20 + 8) + 1;
  }
  bVar19 = unaff_R13 != (Value)0x0 & local_138;
  uStack_88 = VStack_170._0_4_;
  uStack_84 = VStack_170._4_4_;
  if ((bVar19 == 1) && (*(int *)((long)unaff_R13 + 8) == 0)) {
    local_b8 = local_178;
    uStack_b0 = VStack_170._0_4_;
    uStack_ac = VStack_170._4_4_;
    VVar17 = unaff_R13;
    (**(code **)(*(long *)unaff_R13 + 8))();
    local_178._0_4_ = local_b8._0_4_;
    local_178._4_4_ = local_b8._4_4_;
    uStack_88 = uStack_b0;
    uStack_84 = uStack_ac;
  }
  if (bVar18 != 0) {
    pIVar1 = (Inference *)((long)VVar20 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      local_b8._4_4_ = local_178._4_4_;
      local_b8._0_4_ = local_178._0_4_;
      VVar17 = VVar20;
      uStack_b0 = uStack_88;
      uStack_ac = uStack_84;
      (**(code **)(*(long *)VVar20 + 8))();
      local_178._0_4_ = local_b8._0_4_;
      local_178._4_4_ = local_b8._4_4_;
      uStack_88 = uStack_b0;
      uStack_84 = uStack_ac;
    }
    *(int *)((long)VVar20 + 8) = *(int *)((long)VVar20 + 8) + 1;
  }
  if (bVar3 != 0) {
    if (unaff_R13 == (Value)0x0) {
      VVar17 = (Value)0x0;
    }
    else {
      *(int *)((long)unaff_R13 + 8) = *(int *)((long)unaff_R13 + 8) + 1;
      VVar17 = unaff_R13;
    }
  }
  local_1e8._0_4_ = local_208._0_4_;
  local_1e8._4_4_ = local_208._4_4_;
  VStack_1e0._0_4_ = VStack_200._0_4_;
  VStack_1e0._4_4_ = VStack_200._4_4_;
  VStack_1d8._0_4_ = local_1f8._0_4_;
  VStack_1d8._4_4_ = local_1f8._4_4_;
  VStack_1d0._0_4_ = (undefined4)uStack_1f0;
  VStack_1d0._4_4_ = (undefined4)(uStack_1f0 >> 0x20);
  local_80 = local_1e8._0_4_;
  uStack_7c = local_1e8._4_4_;
  uStack_78 = VStack_1e0._0_4_;
  uStack_74 = VStack_1e0._4_4_;
  local_70 = VStack_1d8._0_4_;
  uStack_6c = VStack_1d8._4_4_;
  uStack_68 = VStack_1d0._0_4_;
  uStack_64 = VStack_1d0._4_4_;
  local_60 = bVar7;
  if ((bVar7 != 0) && (local_58 = VVar20, VVar20 != (Value)0x0)) {
    *(int *)((long)VVar20 + 8) = *(int *)((long)VVar20 + 8) + 1;
  }
  local_50 = bVar3;
  local_1e8 = local_208;
  VStack_1e0 = VStack_200;
  VStack_1d8 = local_1f8;
  VStack_1d0 = (Value)uStack_1f0;
  local_90 = local_178._0_4_;
  uStack_8c = local_178._4_4_;
  if (bVar3 == 0) {
    local_40 = '\0';
  }
  else {
    if (unaff_R13 != (Value)0x0) {
      *(int *)((long)unaff_R13 + 8) = *(int *)((long)unaff_R13 + 8) + 1;
    }
    local_40 = '\0';
    local_48 = unaff_R13;
    if (VVar17 != (Value)0x0) {
      pIVar1 = (Inference *)((long)VVar17 + 8);
      *(int *)pIVar1 = *(int *)pIVar1 + -1;
      if (*(int *)pIVar1 == 0) {
        (**(code **)(*(long *)VVar17 + 8))();
      }
    }
  }
  if (bVar18 != 0) {
    pIVar1 = (Inference *)((long)VVar20 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)VVar20 + 8))(VVar20);
    }
  }
  if (bVar19 != 0) {
    pIVar1 = (Inference *)((long)unaff_R13 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)unaff_R13 + 8))(unaff_R13);
    }
  }
  if (bVar18 != 0) {
    pIVar1 = (Inference *)((long)VVar20 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)VVar20 + 8))(VVar20);
    }
  }
  pFVar4 = local_a0;
  VVar17 = local_d8;
  if (local_c0 != (Value)0x0 && bVar3 == 1) {
    pIVar1 = (Inference *)((long)local_c0 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (VVar12 != (Value)0x0 && bVar7 == 1) {
    pIVar1 = (Inference *)((long)VVar12 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)VVar12 + 8))(VVar12);
    }
  }
  pp_Var13 = (_func_int **)::operator_new(0x78,8);
  cVar5 = local_40;
  bVar3 = local_50;
  bVar7 = local_60;
  VStack_1e0 = (Value)CONCAT44(uStack_8c,local_90);
  VStack_1d8._4_4_ = uStack_84;
  VStack_1d8._0_4_ = uStack_88;
  VStack_1d0 = (Value)CONCAT44(uStack_7c,local_80);
  uStack_1c8 = CONCAT44(uStack_74,uStack_78);
  local_1c0 = (Value)CONCAT44(uStack_6c,local_70);
  VStack_1b8 = (Value)CONCAT44(uStack_64,uStack_68);
  local_1b0[0] = local_60;
  if ((local_60 == 1) && (VStack_1a8 = local_58, local_58 != (Value)0x0)) {
    *(int *)((long)local_58 + 8) = *(int *)((long)local_58 + 8) + 1;
  }
  local_1a0 = local_50;
  if ((local_50 == 1) && (local_198 = local_48, local_48 != (Value)0x0)) {
    *(int *)((long)local_48 + 8) = *(int *)((long)local_48 + 8) + 1;
  }
  local_190 = local_40;
  if (local_40 == '\x01') {
    local_188 = local_38;
  }
  *(undefined4 *)(pp_Var13 + 1) = 0;
  *pp_Var13 = (_func_int *)&PTR__ProxyIterator_00b38c58;
  pp_Var13[3] = (_func_int *)VStack_1e0;
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)(pp_Var13 + 4),
             (FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)&VStack_1d8.init);
  *(char *)(pp_Var13 + 0xd) = cVar5;
  if (cVar5 != '\0') {
    pp_Var13[0xe] = local_188;
  }
  (pFVar4->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
  super_InferenceEngine._vptr_InferenceEngine = pp_Var13;
  *(int *)(pp_Var13 + 1) = *(int *)(pp_Var13 + 1) + 1;
  if ((bVar3 != 0) && (local_198 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)local_198 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_198 + 8))();
    }
  }
  if ((VStack_1a8 != (Value)0x0 & bVar7) == 1) {
    pIVar1 = (Inference *)((long)VStack_1a8 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)VStack_1a8 + 8))();
    }
  }
  if ((bVar3 != 0) && (local_48 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)local_48 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if ((bVar7 & local_58 != (Value)0x0) == 1) {
    pIVar1 = (Inference *)((long)local_58 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
  }
  if ((local_138 == 1) && (local_130 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)local_130 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_130 + 8))();
    }
  }
  if ((local_140 != (Value)0x0 & local_148) == 1) {
    pIVar1 = (Inference *)((long)local_140 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_140 + 8))();
    }
  }
  if ((local_e8 == 1) && (local_e0 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)local_e0 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
  }
  if ((local_f0 != (Value)0x0 & local_f8) == 1) {
    pIVar1 = (Inference *)((long)local_f0 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_f0 + 8))();
    }
  }
  if (bVar21 && bVar6) {
    pIVar1 = (Inference *)((long)VVar17 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)VVar17 + 8))(VVar17);
    }
  }
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)pFVar4;
}

Assistant:

Kernel::ClauseIterator FunctionDefinitionRewriting::generateClauses(Clause *premise)
{
  return pvi(premise->iterLits()
    .flatMap([](Literal *lit) {
      NonVariableNonTypeIterator nvi(lit);
      return pvi(pushPairIntoRightIterator(lit, getUniquePersistentIteratorFromPtr(&nvi)));
    })
    .flatMap([this](std::pair<Literal*, Term*> arg){
      return pvi(pushPairIntoRightIterator(arg,
        GeneratingInferenceEngine::_salg->getFunctionDefinitionHandler().getGeneralizations(arg.second)));
    })
    .map([premise](auto arg) {
      auto &qr = arg.second;
      bool temp;
      return (Clause*)performRewriting(premise, arg.first.first, TermList(arg.first.second), qr.data->clause,
        qr.data->literal, qr.data->term, qr.unifier, nullptr, temp,
        Inference(GeneratingInference2(InferenceRule::FUNCTION_DEFINITION_REWRITING, premise, qr.data->clause)));
    })
    .filter(NonzeroFn()));
}